

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O0

ggml_dyn_tallocr * ggml_dyn_tallocr_new(size_t alignment)

{
  ggml_dyn_tallocr *__dest;
  undefined8 in_RDI;
  ggml_dyn_tallocr *alloc;
  undefined8 local_1028 [515];
  ggml_dyn_tallocr *local_10;
  undefined8 local_8;
  
  local_8 = in_RDI;
  __dest = (ggml_dyn_tallocr *)malloc(0x1018);
  local_10 = __dest;
  memset(local_1028,0,0x1018);
  local_1028[0] = local_8;
  memcpy(__dest,local_1028,0x1018);
  ggml_dyn_tallocr_reset(local_10);
  return local_10;
}

Assistant:

static struct ggml_dyn_tallocr * ggml_dyn_tallocr_new(size_t alignment) {
    struct ggml_dyn_tallocr * alloc = (struct ggml_dyn_tallocr *)malloc(sizeof(struct ggml_dyn_tallocr));

    *alloc = (struct ggml_dyn_tallocr) {
        /*.alignment     = */ alignment,
        /*.n_free_blocks = */ 0,
        /*.free_blocks   = */ {{0}},
        /*.max_size      = */ 0,
#ifdef GGML_ALLOCATOR_DEBUG
        /*.allocated_tensors = */ {{0}},
#endif
    };

    ggml_dyn_tallocr_reset(alloc);

    return alloc;
}